

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O3

string_view __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeReader::Seek(CordRepBtreeReader *this,size_t offset)

{
  CordRepBtree *pCVar1;
  CordRep *pCVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  CordRep *pCVar7;
  uint8_t *puVar8;
  byte bVar9;
  Position PVar10;
  string_view sVar11;
  
  PVar10 = CordRepBtreeNavigator::Seek(&this->navigator_,offset);
  uVar6 = PVar10.offset;
  pCVar2 = PVar10.edge;
  if (pCVar2 == (CordRep *)0x0) {
    sVar5 = 0;
    puVar8 = (uint8_t *)0x0;
    sVar3 = 0;
  }
  else {
    bVar9 = pCVar2->tag;
    if (bVar9 < 5) {
      if (bVar9 != 1) {
LAB_001114f0:
        __assert_fail("IsDataEdge(edge)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                      ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
      }
      pCVar7 = *(CordRep **)&pCVar2[1].refcount;
      bVar9 = pCVar7->tag;
      if (bVar9 < 5) goto LAB_001114f0;
      sVar5 = pCVar2[1].length;
    }
    else {
      sVar5 = 0;
      pCVar7 = pCVar2;
    }
    if (bVar9 < 6) {
      puVar8 = (uint8_t *)pCVar7[1].length;
    }
    else {
      if (0xf8 < bVar9) goto LAB_00111524;
      puVar8 = pCVar7->storage;
    }
    sVar3 = pCVar2->length - uVar6;
    if (pCVar2->length < uVar6) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
LAB_00111524:
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    lVar4 = (long)(this->navigator_).height_;
    if ((lVar4 < 0) || (pCVar1 = (this->navigator_).node_[lVar4], pCVar1 == (CordRepBtree *)0x0)) {
      __assert_fail("btree() != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                    ,0xa3,"size_t absl::cord_internal::CordRepBtreeReader::length() const");
    }
    puVar8 = puVar8 + uVar6 + sVar5;
    sVar5 = (pCVar1->super_CordRep).length - (offset + sVar3);
  }
  this->remaining_ = sVar5;
  sVar11._M_str = (char *)puVar8;
  sVar11._M_len = sVar3;
  return sVar11;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Seek(size_t offset) {
  const CordRepBtreeNavigator::Position pos = navigator_.Seek(offset);
  if (ABSL_PREDICT_FALSE(pos.edge == nullptr)) {
    remaining_ = 0;
    return {};
  }
  absl::string_view chunk = EdgeData(pos.edge).substr(pos.offset);
  remaining_ = length() - offset - chunk.length();
  return chunk;
}